

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O0

void __thiscall GenCADFile::GenCADFile(GenCADFile *this,vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  undefined8 *in_RDI;
  BRDFileBase *in_stack_00000020;
  vector<char,_std::allocator<char>_> *in_stack_00001638;
  GenCADFile *in_stack_00001640;
  
  BRDFileBase::BRDFileBase(in_stack_00000020);
  *in_RDI = &PTR__GenCADFile_003030a0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)((long)in_RDI + 0xc4) = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  std::
  map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x186d2e);
  *(undefined4 *)(in_RDI + 0x26) = 0;
  bVar1 = parse_file(in_stack_00001640,in_stack_00001638);
  *(bool *)(in_RDI + 0x12) = bVar1;
  return;
}

Assistant:

GenCADFile::GenCADFile(const std::vector<char> &buf) {
	valid = parse_file(buf);
}